

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunSomeIndexTests.cpp
# Opt level: O1

int main(int ac,char **av)

{
  int iVar1;
  clock_t cVar2;
  clock_t cVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  functionMapEntry *pfVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  int testNum;
  uint local_44;
  char *local_40;
  uint local_34;
  
  local_44 = 0;
  uVar5 = 0xffffffff;
  if (ac < 2) {
    puts("Available tests:");
    pfVar9 = cmakeGeneratedFunctionMapEntries;
    uVar7 = 0;
    do {
      printf("%3d. %s\n",uVar7 & 0xffffffff,pfVar9->name);
      uVar7 = uVar7 + 1;
      pfVar9 = pfVar9 + 1;
    } while (uVar7 != 3);
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&local_44);
    if (iVar1 != 1) {
      pcVar6 = "Couldn\'t parse that input as a number";
      goto LAB_00106ba2;
    }
    if (2 < (int)local_44) {
      pcVar6 = "%3d is an invalid test number.\n";
      goto LAB_00106d57;
    }
    ac = ac + -1;
    av = av + 1;
    uVar5 = local_44;
  }
  if (ac < 2 || uVar5 != 0xffffffff) {
    uVar8 = 0;
    bVar12 = true;
  }
  else {
    pcVar6 = av[1];
    iVar1 = strcmp(pcVar6,"-R");
    uVar8 = (uint)(iVar1 == 0);
    iVar1 = strcmp(pcVar6,"-A");
    bVar12 = iVar1 != 0;
  }
  if ((ac < 3 & (byte)uVar8) != 1) {
    if (!bVar12) {
      puts("TAP version 13");
      printf("1..%d\n",3);
      lVar10 = 0;
      do {
        pcVar6 = cmakeGeneratedFunctionMapEntries[lVar10].name;
        if (2 < ac) {
          uVar7 = 0;
          do {
            iVar1 = strcmp(pcVar6,av[uVar7 + 2]);
            if (iVar1 == 0) {
              printf("ok %d %s # SKIP\n",(ulong)((int)lVar10 + 1),pcVar6);
              goto LAB_00106ca6;
            }
            uVar7 = uVar7 + 1;
          } while (ac - 2 != uVar7);
        }
        cVar2 = clock();
        iVar1 = (*cmakeGeneratedFunctionMapEntries[lVar10].func)(ac,av);
        cVar3 = clock();
        pcVar4 = "ok";
        if (iVar1 == -1) {
          pcVar4 = "not ok";
        }
        printf("%s %d %s # %f\n",(double)(cVar3 - cVar2) / 1000000.0,pcVar4,(ulong)((int)lVar10 + 1)
               ,pcVar6);
LAB_00106ca6:
        lVar10 = lVar10 + 1;
        if (lVar10 == 3) {
          puts("All tests finished.");
          return 0;
        }
      } while( true );
    }
    local_34 = uVar8;
    if (uVar5 == 0xffffffff) {
      local_40 = lowercase(av[(ulong)uVar8 + 1]);
    }
    else {
      local_40 = (char *)0x0;
    }
    bVar12 = uVar5 == 0xffffffff;
    if (bVar12) {
      pfVar9 = cmakeGeneratedFunctionMapEntries;
      uVar7 = 0;
      do {
        pcVar6 = lowercase(pfVar9->name);
        uVar8 = local_34;
        if ((local_34 == 0) || (pcVar4 = strstr(pcVar6,local_40), pcVar4 == (char *)0x0)) {
          uVar5 = 0xffffffff;
          if ((uVar8 == 0) && (iVar1 = strcmp(pcVar6,local_40), iVar1 == 0)) {
            ac = ac + -1;
            av = av + 1;
            goto LAB_00106db4;
          }
        }
        else {
          ac = ac + -2;
          av = av + 2;
LAB_00106db4:
          uVar5 = (uint)uVar7;
        }
        free(pcVar6);
        bVar12 = uVar5 == 0xffffffff;
        if (!bVar12) break;
        pfVar9 = pfVar9 + 1;
        bVar11 = uVar7 < 2;
        uVar7 = uVar7 + 1;
      } while (bVar11);
    }
    free(local_40);
    if (bVar12) {
      puts("Available tests:");
      pfVar9 = cmakeGeneratedFunctionMapEntries;
      uVar7 = 0;
      do {
        printf("%3d. %s\n",uVar7 & 0xffffffff,pfVar9->name);
        uVar7 = uVar7 + 1;
        pfVar9 = pfVar9 + 1;
      } while (uVar7 != 3);
      printf("Failed: %s is an invalid test name.\n",av[1]);
      return -1;
    }
    if (uVar5 < 3) {
      iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar5].func)(ac,av);
      return iVar1;
    }
    pcVar6 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_00106d57:
    printf(pcVar6,(ulong)local_44);
    return -1;
  }
  pcVar6 = "-R needs an additional parameter.";
LAB_00106ba2:
  puts(pcVar6);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}